

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

string * __thiscall Node::label_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  string llvmTemporaryString;
  raw_string_ostream llvmStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [2];
  
  std::__cxx11::to_string(&local_b8,this->id_);
  std::operator+(&local_d8,"[label=\"<",&local_b8);
  std::operator+(local_78,&local_d8,"> ");
  nodeTypeToString_abi_cxx11_(&local_98,this->nodeType_);
  std::operator+(__return_storage_ptr__,local_78,&local_98);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  if (this->llvmInstruction_ != (Instruction *)0x0) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    llvm::raw_string_ostream::raw_string_ostream((raw_string_ostream *)local_78,&local_d8);
    llvm::Value::print((raw_ostream *)this->llvmInstruction_,SUB81(local_78,0));
    std::operator+(&local_b8,"\n",&local_d8);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
    llvm::raw_ostream::~raw_ostream((raw_ostream *)local_78);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string Node::label() const {
    std::string label_ = "[label=\"<" + std::to_string(this->id()) + "> " +
                         nodeTypeToString(this->getType());
    if (!isArtificial()) {
        string llvmTemporaryString;
        raw_string_ostream llvmStream(llvmTemporaryString);
        llvmInstruction_->print(llvmStream);
        label_ += "\n" + llvmTemporaryString;
    }
    label_ += " \"]";
    return label_;
}